

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

confirm * __thiscall lest::confirm::operator()(confirm *this,test *testing)

{
  env *__args;
  text local_40;
  
  this->selected = this->selected + 1;
  std::__cxx11::string::string((string *)&local_40,(string *)testing);
  __args = env::operator()(&this->output,&local_40);
  std::function<void_(lest::env_&)>::operator()(&testing->behaviour,__args);
  std::__cxx11::string::~string((string *)&local_40);
  return this;
}

Assistant:

confirm & operator()( test testing )
    {
        try
        {
            ++selected; testing.behaviour( output( testing.name ) );
        }
        catch( message const & e )
        {
            ++failures; report( os, e, output.context() );
        }
        return *this;
    }